

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42parse.c
# Opt level: O3

void t42_parse_encoding(T42_Face face,T42_Loader loader)

{
  PS_TableRec *pPVar1;
  byte bVar2;
  byte bVar3;
  byte *pbVar4;
  undefined8 *puVar5;
  _func_void_PS_Table *p_Var6;
  int iVar7;
  FT_Error FVar8;
  FT_Long FVar9;
  FT_UShort *pFVar10;
  FT_String **ppFVar11;
  ulong uVar12;
  int iVar13;
  byte *pbVar14;
  byte *pbVar15;
  int local_3c;
  int iStack_38;
  FT_Error error;
  
  pbVar4 = (loader->parser).root.limit;
  puVar5 = (undefined8 *)face->psaux;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  pbVar15 = (loader->parser).root.cursor;
  if (pbVar15 < pbVar4) {
    bVar2 = *pbVar15;
    if (bVar2 != 0x5b && 9 < bVar2 - 0x30) {
      if ((pbVar15 + 0x11 < pbVar4) &&
         (iVar7 = strncmp((char *)pbVar15,"StandardEncoding",0x10), iVar7 == 0)) {
        (face->type1).encoding_type = T1_ENCODING_TYPE_STANDARD;
        return;
      }
      if ((pbVar15 + 0xf < pbVar4) &&
         (iVar7 = strncmp((char *)pbVar15,"ExpertEncoding",0xe), iVar7 == 0)) {
        (face->type1).encoding_type = T1_ENCODING_TYPE_EXPERT;
        return;
      }
      if ((pbVar15 + 0x12 < pbVar4) &&
         (iVar7 = strncmp((char *)pbVar15,"ISOLatin1Encoding",0x11), iVar7 == 0)) {
        (face->type1).encoding_type = T1_ENCODING_TYPE_ISOLATIN1;
        return;
      }
      (loader->parser).root.error = 0xa2;
      return;
    }
    _iStack_38 = (loader->parser).root.memory;
    if (bVar2 == 0x5b) {
      (loader->parser).root.cursor = pbVar15 + 1;
      FVar9 = 0x100;
    }
    else {
      FVar9 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
      if (0x100 < (int)FVar9) goto LAB_00235e38;
    }
    (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
    if ((loader->parser).root.cursor < pbVar4) {
      pPVar1 = &loader->encoding_table;
      pFVar10 = (face->type1).encoding.char_index;
      if (pFVar10 != (FT_UShort *)0x0) {
        ft_mem_free(_iStack_38,pFVar10);
        (face->type1).encoding.char_index = (FT_UShort *)0x0;
        ft_mem_free(_iStack_38,(face->type1).encoding.char_name);
        (face->type1).encoding.char_name = (FT_String **)0x0;
        p_Var6 = (loader->encoding_table).funcs.release;
        if (p_Var6 != (_func_void_PS_Table *)0x0) {
          (*p_Var6)(pPVar1);
        }
      }
      iVar7 = (int)FVar9;
      (face->type1).encoding.num_chars = iVar7;
      loader->num_chars = iVar7;
      pFVar10 = (FT_UShort *)ft_mem_realloc(_iStack_38,2,0,(long)iVar7,(void *)0x0,&local_3c);
      (face->type1).encoding.char_index = pFVar10;
      if (local_3c == 0) {
        ppFVar11 = (FT_String **)ft_mem_realloc(_iStack_38,8,0,(long)iVar7,(void *)0x0,&local_3c);
        (face->type1).encoding.char_name = ppFVar11;
        if ((local_3c == 0) &&
           (local_3c = (**(code **)*puVar5)(pPVar1,FVar9,_iStack_38), local_3c == 0)) {
          local_3c = 0;
          if (0 < iVar7) {
            iVar13 = 0;
            do {
              (*(loader->encoding_table).funcs.add)(pPVar1,iVar13,".notdef",8);
              iVar13 = iVar13 + 1;
            } while (iVar7 != iVar13);
          }
          (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
          pbVar14 = (loader->parser).root.cursor;
          if (pbVar14 < pbVar4) {
            _iStack_38 = (FT_Memory)((ulong)_iStack_38 & 0xffffffff00000000);
            do {
              bVar3 = *pbVar14;
              if (bVar3 == 100) {
                pbVar15 = pbVar14 + 3;
                if ((((pbVar15 < pbVar4) && (pbVar14[1] == 0x65)) && (pbVar14[2] == 0x66)) &&
                   (((ulong)*pbVar15 < 0x21 && ((0x100003601U >> ((ulong)*pbVar15 & 0x3f) & 1) != 0)
                    ))) break;
              }
              else if (bVar3 == 0x5d) {
                pbVar15 = pbVar14 + 1;
                break;
              }
              pbVar15 = pbVar14;
              if ((bVar2 == 0x5b) || (bVar3 - 0x30 < 10)) {
                if (bVar2 == 0x5b) {
                  iVar13 = (int)_iStack_38;
                }
                else {
                  FVar9 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
                  iVar13 = (int)FVar9;
                  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
                  pbVar15 = (loader->parser).root.cursor;
                  if (pbVar14 == pbVar15) goto LAB_002360ff;
                }
                if (((pbVar15 + 2 < pbVar4) && (*pbVar15 == 0x2f)) && (iStack_38 < iVar7)) {
                  pbVar15 = pbVar15 + 1;
                  (loader->parser).root.cursor = pbVar15;
                  (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
                  pbVar14 = (loader->parser).root.cursor;
                  if (pbVar4 <= pbVar14) {
                    return;
                  }
                  if ((loader->parser).root.error != 0) {
                    return;
                  }
                  uVar12 = (long)pbVar14 - (long)pbVar15;
                  FVar8 = (*(loader->encoding_table).funcs.add)
                                    (pPVar1,iVar13,pbVar15,(int)uVar12 + 1);
                  (loader->parser).root.error = FVar8;
                  if (FVar8 != 0) {
                    return;
                  }
                  (loader->encoding_table).elements[iVar13][uVar12 & 0xffffffff] = '\0';
                  _iStack_38 = (FT_Memory)CONCAT44(error,iStack_38 + 1);
                }
                else if (bVar2 == 0x5b) {
LAB_002360ff:
                  (loader->parser).root.error = 2;
                  return;
                }
              }
              else {
                (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
                if ((loader->parser).root.error != 0) {
                  return;
                }
              }
              (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
              pbVar14 = (loader->parser).root.cursor;
            } while (pbVar14 < pbVar4);
          }
          (face->type1).encoding_type = T1_ENCODING_TYPE_ARRAY;
          (loader->parser).root.cursor = pbVar15;
          return;
        }
      }
      (loader->parser).root.error = local_3c;
    }
  }
  else {
LAB_00235e38:
    (loader->parser).root.error = 3;
  }
  return;
}

Assistant:

static void
  t42_parse_encoding( T42_Face    face,
                      T42_Loader  loader )
  {
    T42_Parser  parser = &loader->parser;
    FT_Byte*    cur;
    FT_Byte*    limit  = parser->root.limit;

    PSAux_Service  psaux  = (PSAux_Service)face->psaux;


    T1_Skip_Spaces( parser );
    cur = parser->root.cursor;
    if ( cur >= limit )
    {
      FT_ERROR(( "t42_parse_encoding: out of bounds\n" ));
      parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    /* if we have a number or `[', the encoding is an array, */
    /* and we must load it now                               */
    if ( ft_isdigit( *cur ) || *cur == '[' )
    {
      T1_Encoding  encode          = &face->type1.encoding;
      FT_Int       count, n;
      PS_Table     char_table      = &loader->encoding_table;
      FT_Memory    memory          = parser->root.memory;
      FT_Error     error;
      FT_Bool      only_immediates = 0;


      /* read the number of entries in the encoding; should be 256 */
      if ( *cur == '[' )
      {
        count           = 256;
        only_immediates = 1;
        parser->root.cursor++;
      }
      else
        count = (FT_Int)T1_ToInt( parser );

      /* only composite fonts (which we don't support) */
      /* can have larger values                        */
      if ( count > 256 )
      {
        FT_ERROR(( "t42_parse_encoding: invalid encoding array size\n" ));
        parser->root.error = FT_THROW( Invalid_File_Format );
        return;
      }

      T1_Skip_Spaces( parser );
      if ( parser->root.cursor >= limit )
        return;

      /* PostScript happily allows overwriting of encoding arrays */
      if ( encode->char_index )
      {
        FT_FREE( encode->char_index );
        FT_FREE( encode->char_name );
        T1_Release_Table( char_table );
      }

      /* we use a T1_Table to store our charnames */
      loader->num_chars = encode->num_chars = count;
      if ( FT_NEW_ARRAY( encode->char_index, count )     ||
           FT_NEW_ARRAY( encode->char_name,  count )     ||
           FT_SET_ERROR( psaux->ps_table_funcs->init(
                           char_table, count, memory ) ) )
      {
        parser->root.error = error;
        return;
      }

      /* We need to `zero' out encoding_table.elements */
      for ( n = 0; n < count; n++ )
      {
        char*  notdef = (char *)".notdef";


        (void)T1_Add_Table( char_table, n, notdef, 8 );
      }

      /* Now we need to read records of the form                */
      /*                                                        */
      /*   ... charcode /charname ...                           */
      /*                                                        */
      /* for each entry in our table.                           */
      /*                                                        */
      /* We simply look for a number followed by an immediate   */
      /* name.  Note that this ignores correctly the sequence   */
      /* that is often seen in type42 fonts:                    */
      /*                                                        */
      /*   0 1 255 { 1 index exch /.notdef put } for dup        */
      /*                                                        */
      /* used to clean the encoding array before anything else. */
      /*                                                        */
      /* Alternatively, if the array is directly given as       */
      /*                                                        */
      /*   /Encoding [ ... ]                                    */
      /*                                                        */
      /* we only read immediates.                               */

      n = 0;
      T1_Skip_Spaces( parser );

      while ( parser->root.cursor < limit )
      {
        cur = parser->root.cursor;

        /* we stop when we encounter `def' or `]' */
        if ( *cur == 'd' && cur + 3 < limit )
        {
          if ( cur[1] == 'e'          &&
               cur[2] == 'f'          &&
               t42_is_space( cur[3] ) )
          {
            FT_TRACE6(( "encoding end\n" ));
            cur += 3;
            break;
          }
        }
        if ( *cur == ']' )
        {
          FT_TRACE6(( "encoding end\n" ));
          cur++;
          break;
        }

        /* check whether we have found an entry */
        if ( ft_isdigit( *cur ) || only_immediates )
        {
          FT_Int  charcode;


          if ( only_immediates )
            charcode = n;
          else
          {
            charcode = (FT_Int)T1_ToInt( parser );
            T1_Skip_Spaces( parser );

            /* protect against invalid charcode */
            if ( cur == parser->root.cursor )
            {
              parser->root.error = FT_THROW( Unknown_File_Format );
              return;
            }
          }

          cur = parser->root.cursor;

          if ( cur + 2 < limit && *cur == '/' && n < count )
          {
            FT_UInt  len;


            cur++;

            parser->root.cursor = cur;
            T1_Skip_PS_Token( parser );
            if ( parser->root.cursor >= limit )
              return;
            if ( parser->root.error )
              return;

            len = (FT_UInt)( parser->root.cursor - cur );

            parser->root.error = T1_Add_Table( char_table, charcode,
                                               cur, len + 1 );
            if ( parser->root.error )
              return;
            char_table->elements[charcode][len] = '\0';

            n++;
          }
          else if ( only_immediates )
          {
            /* Since the current position is not updated for           */
            /* immediates-only mode we would get an infinite loop if   */
            /* we don't do anything here.                              */
            /*                                                         */
            /* This encoding array is not valid according to the       */
            /* type42 specification (it might be an encoding for a CID */
            /* type42 font, however), so we conclude that this font is */
            /* NOT a type42 font.                                      */
            parser->root.error = FT_THROW( Unknown_File_Format );
            return;
          }
        }
        else
        {
          T1_Skip_PS_Token( parser );
          if ( parser->root.error )
            return;
        }

        T1_Skip_Spaces( parser );
      }

      face->type1.encoding_type = T1_ENCODING_TYPE_ARRAY;
      parser->root.cursor       = cur;
    }

    /* Otherwise, we should have either `StandardEncoding', */
    /* `ExpertEncoding', or `ISOLatin1Encoding'             */
    else
    {
      if ( cur + 17 < limit                                            &&
           ft_strncmp( (const char*)cur, "StandardEncoding", 16 ) == 0 )
        face->type1.encoding_type = T1_ENCODING_TYPE_STANDARD;

      else if ( cur + 15 < limit                                          &&
                ft_strncmp( (const char*)cur, "ExpertEncoding", 14 ) == 0 )
        face->type1.encoding_type = T1_ENCODING_TYPE_EXPERT;

      else if ( cur + 18 < limit                                             &&
                ft_strncmp( (const char*)cur, "ISOLatin1Encoding", 17 ) == 0 )
        face->type1.encoding_type = T1_ENCODING_TYPE_ISOLATIN1;

      else
        parser->root.error = FT_ERR( Ignore );
    }
  }